

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitSwitchStatement(SyntaxDumper *this,SwitchStatementSyntax *node)

{
  SyntaxToken local_50;
  
  SwitchStatementSyntax::switchKeyword(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  SwitchStatementSyntax::openParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->cond_);
  SwitchStatementSyntax::closeParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->stmt_);
  return Skip;
}

Assistant:

virtual Action visitSwitchStatement(const SwitchStatementSyntax* node) override
    {
        terminal(node->switchKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->condition());
        terminal(node->closeParenthesisToken(), node);
        nonterminal(node->statement());
        return Action::Skip;
    }